

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::torrent::tracker_response
          (torrent *this,tracker_request *r,address *tracker_ip,
          list<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *tracker_ips,
          tracker_response *resp)

{
  int *piVar1;
  string *args_4;
  size_t *psVar2;
  undefined2 uVar3;
  uint uVar4;
  undefined4 uVar5;
  session_interface *psVar6;
  element_type *peVar7;
  size_type sVar8;
  pointer pcVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  i2p_connection *piVar11;
  element_type *peVar12;
  pointer piVar13;
  pointer piVar14;
  peer_list *ppVar15;
  pointer ppVar16;
  pointer ppVar17;
  pointer piVar18;
  pointer piVar19;
  ushort uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined1 auVar23 [16];
  element_type *peVar24;
  protocol_version pVar25;
  _Alloc_hider __s;
  io_context *piVar26;
  undefined1 auVar27 [8];
  element_type *peVar28;
  bool bVar29;
  pex_flags_t flags;
  time_point32 now;
  uint uVar30;
  int iVar31;
  announce_entry *this_00;
  announce_endpoint *args_1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 *puVar32;
  _List_node_base *p_Var33;
  _List_node_base *p_Var34;
  torrent_peer *ptVar35;
  uint *puVar36;
  char *pcVar37;
  size_t sVar38;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  event_t eVar39;
  tracker_response *ptVar40;
  ulong uVar41;
  address *extraout_RDX;
  address *paVar42;
  address *extraout_RDX_00;
  address *addr;
  ipv4_peer_entry *i;
  pointer piVar43;
  pointer piVar44;
  torrent *ptVar45;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar46;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  tracker_request *ptVar47;
  const_iterator __end3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  string_view destination_00;
  string_view s2;
  span<const_char> s;
  string_view s1;
  protocol_version v;
  string destination;
  peer_entry p;
  torrent_state st_1;
  endpoint local_endpoint;
  string resolved_to;
  undefined1 local_701 [33];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_6e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6d8;
  allocator<char> local_6c9;
  undefined1 local_6c8 [16];
  undefined1 local_6b8 [16];
  anon_union_16_3_a3f0114d_for___in6_u local_6a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_698;
  undefined1 local_688 [16];
  i2p_connection *local_678;
  undefined8 local_670;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_668;
  undefined8 local_660;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_658;
  undefined1 local_648 [16];
  undefined1 local_638 [24];
  string local_620;
  io_context *local_600 [2];
  io_context local_5f0;
  undefined1 local_5e0 [8];
  undefined1 local_5d8 [16];
  undefined1 local_5c8 [16];
  undefined1 local_5b8 [8];
  undefined1 local_5b0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_5a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_598;
  undefined4 local_588;
  undefined1 local_578 [24];
  anon_union_16_3_a3f0114d_for___in6_u local_560;
  anon_class_8_1_8991fb9c_for_m_handler local_550;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_548;
  anon_union_16_3_a3f0114d_for___in6_u local_540;
  element_type *local_530;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_528;
  pointer local_4e0;
  pointer local_4d0;
  error_code local_4c8;
  data_union local_4b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_490;
  i2p_connection *local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  i2p_connection *local_460;
  undefined1 local_458 [16];
  undefined1 local_448 [16];
  undefined1 local_438 [16];
  undefined1 local_428 [8];
  anon_union_16_3_a3f0114d_for___in6_u aStack_420;
  unsigned_long local_410;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408 [6];
  element_type *local_3a0;
  element_type *local_398;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_390;
  
  paVar42 = &resp->external_ip;
  local_428[0] = '\0';
  local_428._1_7_ = 0;
  aStack_420._0_8_ = (element_type *)0x0;
  local_438._0_4_ = ipv4;
  local_438._4_4_ = 0;
  local_438._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_701._17_8_ = resp;
  bVar29 = boost::asio::ip::operator!=(paVar42,(address *)local_438);
  local_701._25_8_ = r;
  if (bVar29) {
    if (tracker_ip->type_ == ipv4) {
      if ((tracker_ip->ipv4_address_).addr_.s_addr != 0) goto LAB_00317ab1;
    }
    else {
      auVar50[0] = -((tracker_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[0] == '\0');
      auVar50[1] = -((tracker_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[1] == '\0');
      auVar50[2] = -((tracker_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[2] == '\0');
      auVar50[3] = -((tracker_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[3] == '\0');
      auVar50[4] = -((tracker_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[4] == '\0');
      auVar50[5] = -((tracker_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[5] == '\0');
      auVar50[6] = -((tracker_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[6] == '\0');
      auVar50[7] = -((tracker_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[7] == '\0');
      auVar50[8] = -((tracker_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[8] == '\0');
      auVar50[9] = -((tracker_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[9] == '\0');
      auVar50[10] = -((tracker_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[10] == '\0');
      auVar50[0xb] = -((tracker_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[0xb] == '\0');
      auVar50[0xc] = -((tracker_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[0xc] == '\0');
      auVar50[0xd] = -((tracker_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[0xd] == '\0');
      auVar50[0xe] = -((tracker_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[0xe] == '\0');
      auVar50[0xf] = -((tracker_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[0xf] == '\0');
      if ((ushort)((ushort)(SUB161(auVar50 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar50 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar50 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar50 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar50 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar50 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar50 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar50 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar50 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar50 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar50 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar50 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar50 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar50 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar50 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar50[0xf] >> 7) << 0xf) != 0xffff) {
LAB_00317ab1:
        p_Var10 = (r->outgoing_socket).m_sock.
                  super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if ((p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (p_Var10->_M_use_count != 0)) {
          psVar6 = (this->super_torrent_hot_members).m_ses;
          listen_socket_handle::get_local_endpoint((endpoint *)local_438,&r->outgoing_socket);
          r = (tracker_request *)local_701._25_8_;
          (*(psVar6->super_session_logger)._vptr_session_logger[2])
                    (psVar6,(endpoint *)local_438,paVar42,8);
        }
      }
    }
  }
  local_701._9_8_ = paVar42;
  local_6d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)tracker_ip;
  now = time_now32();
  peVar7 = (this->super_torrent_hot_members).m_torrent_file.
           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  auVar51[0] = -((char)(r->info_hash).m_number._M_elems[0] ==
                (char)(peVar7->m_info_hash).v1.m_number._M_elems[0]);
  auVar51[1] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 1) ==
                *(char *)((long)(peVar7->m_info_hash).v1.m_number._M_elems + 1));
  auVar51[2] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 2) ==
                *(char *)((long)(peVar7->m_info_hash).v1.m_number._M_elems + 2));
  auVar51[3] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 3) ==
                *(char *)((long)(peVar7->m_info_hash).v1.m_number._M_elems + 3));
  auVar51[4] = -((char)(r->info_hash).m_number._M_elems[1] ==
                (char)(peVar7->m_info_hash).v1.m_number._M_elems[1]);
  auVar51[5] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 5) ==
                *(char *)((long)(peVar7->m_info_hash).v1.m_number._M_elems + 5));
  auVar51[6] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 6) ==
                *(char *)((long)(peVar7->m_info_hash).v1.m_number._M_elems + 6));
  auVar51[7] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 7) ==
                *(char *)((long)(peVar7->m_info_hash).v1.m_number._M_elems + 7));
  auVar51[8] = -((char)(r->info_hash).m_number._M_elems[2] ==
                (char)(peVar7->m_info_hash).v1.m_number._M_elems[2]);
  auVar51[9] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 9) ==
                *(char *)((long)(peVar7->m_info_hash).v1.m_number._M_elems + 9));
  auVar51[10] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 10) ==
                 *(char *)((long)(peVar7->m_info_hash).v1.m_number._M_elems + 10));
  auVar51[0xb] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 0xb) ==
                  *(char *)((long)(peVar7->m_info_hash).v1.m_number._M_elems + 0xb));
  auVar51[0xc] = -((char)(r->info_hash).m_number._M_elems[3] ==
                  (char)(peVar7->m_info_hash).v1.m_number._M_elems[3]);
  auVar51[0xd] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 0xd) ==
                  *(char *)((long)(peVar7->m_info_hash).v1.m_number._M_elems + 0xd));
  auVar51[0xe] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 0xe) ==
                  *(char *)((long)(peVar7->m_info_hash).v1.m_number._M_elems + 0xe));
  auVar51[0xf] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 0xf) ==
                  *(char *)((long)(peVar7->m_info_hash).v1.m_number._M_elems + 0xf));
  uVar30 = (peVar7->m_info_hash).v1.m_number._M_elems[4];
  uVar4 = (r->info_hash).m_number._M_elems[4];
  auVar53[0] = -((char)uVar4 == (char)uVar30);
  auVar53[1] = -((char)(uVar4 >> 8) == (char)(uVar30 >> 8));
  auVar53[2] = -((char)(uVar4 >> 0x10) == (char)(uVar30 >> 0x10));
  auVar53[3] = -((char)(uVar4 >> 0x18) == (char)(uVar30 >> 0x18));
  auVar53[4] = 0xff;
  auVar53[5] = 0xff;
  auVar53[6] = 0xff;
  auVar53[7] = 0xff;
  auVar53[8] = 0xff;
  auVar53[9] = 0xff;
  auVar53[10] = 0xff;
  auVar53[0xb] = 0xff;
  auVar53[0xc] = 0xff;
  auVar53[0xd] = 0xff;
  auVar53[0xe] = 0xff;
  auVar53[0xf] = 0xff;
  auVar53 = auVar53 & auVar51;
  uVar20 = (ushort)(SUB161(auVar53 >> 7,0) & 1) | (ushort)(SUB161(auVar53 >> 0xf,0) & 1) << 1 |
           (ushort)(SUB161(auVar53 >> 0x17,0) & 1) << 2 |
           (ushort)(SUB161(auVar53 >> 0x1f,0) & 1) << 3 |
           (ushort)(SUB161(auVar53 >> 0x27,0) & 1) << 4 |
           (ushort)(SUB161(auVar53 >> 0x2f,0) & 1) << 5 |
           (ushort)(SUB161(auVar53 >> 0x37,0) & 1) << 6 |
           (ushort)(SUB161(auVar53 >> 0x3f,0) & 1) << 7 |
           (ushort)(SUB161(auVar53 >> 0x47,0) & 1) << 8 |
           (ushort)(SUB161(auVar53 >> 0x4f,0) & 1) << 9 |
           (ushort)(SUB161(auVar53 >> 0x57,0) & 1) << 10 |
           (ushort)(SUB161(auVar53 >> 0x5f,0) & 1) << 0xb |
           (ushort)(SUB161(auVar53 >> 0x67,0) & 1) << 0xc |
           (ushort)(SUB161(auVar53 >> 0x6f,0) & 1) << 0xd |
           (ushort)(SUB161(auVar53 >> 0x77,0) & 1) << 0xe | (ushort)(byte)(auVar53[0xf] >> 7) << 0xf
  ;
  ptVar40 = (tracker_response *)(ulong)uVar20;
  local_701[0] = uVar20 != 0xffff;
  local_701._1_8_ = this;
  this_00 = tracker_list::find_tracker(&this->m_trackers,&r->url);
  local_4b8._8_4_ = 0;
  local_4b8._12_4_ = 0;
  local_4b8._16_4_ = 0;
  local_4b8._20_4_ = 0;
  local_4b8.v6.sin6_scope_id = 0;
  local_4b8._0_8_ = 2;
  if (this_00 != (announce_entry *)0x0) {
    args_1 = announce_entry::find_endpoint
                       (this_00,(listen_socket_handle *)(local_701._25_8_ + 0xe0));
    if (args_1 != (announce_endpoint *)0x0) {
      uVar41 = (ulong)local_701[0];
      local_4b8._0_8_ = *(undefined8 *)&(args_1->local_endpoint).impl_.data_;
      uVar21 = *(undefined8 *)((long)&(args_1->local_endpoint).impl_.data_ + 8);
      uVar22 = *(undefined8 *)((long)&(args_1->local_endpoint).impl_.data_ + 0x14);
      local_4b8._16_4_ =
           (undefined4)
           ((ulong)*(undefined8 *)((long)&(args_1->local_endpoint).impl_.data_ + 0xc) >> 0x20);
      local_4b8._20_4_ = (undefined4)uVar22;
      local_4b8.v6.sin6_scope_id = (uint32_t)((ulong)uVar22 >> 0x20);
      local_4b8._8_4_ = (undefined4)uVar21;
      local_4b8._12_4_ = (undefined4)((ulong)uVar21 >> 0x20);
      if (-1 < *(int *)(local_701._17_8_ + 0xec)) {
        (args_1->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>._M_elems
        [local_701[0]].scrape_incomplete = *(int *)(local_701._17_8_ + 0xec);
      }
      if (-1 < *(int *)(local_701._17_8_ + 0xe8)) {
        (args_1->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>._M_elems
        [local_701[0]].scrape_complete = *(int *)(local_701._17_8_ + 0xe8);
      }
      if (-1 < *(int *)(local_701._17_8_ + 0xf4)) {
        (args_1->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>._M_elems
        [local_701[0]].scrape_downloaded = *(int *)(local_701._17_8_ + 0xf4);
      }
      uVar30 = *(uint *)&(args_1->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>.
                         _M_elems[local_701[0]].field_0x44;
      eVar39 = *(event_t *)(local_701._25_8_ + 0x7a);
      if (eVar39 == started && (uVar30 >> 8 & 1) == 0) {
        uVar30 = uVar30 | 0x100;
        *(short *)&(args_1->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>.
                   _M_elems[local_701[0]].field_0x44 = (short)uVar30;
        eVar39 = *(event_t *)(local_701._25_8_ + 0x7a);
      }
      if (((uVar30 >> 9 & 1) == 0) && (eVar39 == completed)) {
        *(ushort *)
         &(args_1->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>._M_elems
          [local_701[0]].field_0x44 = (ushort)uVar30 | 0x200;
        *(undefined1 *)(local_701._1_8_ + 0x606) = *(undefined1 *)(local_701._1_8_ + 0x606) | 0x40;
      }
      this_00->field_0x6e = this_00->field_0x6e | 0x10;
      (args_1->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>._M_elems
      [local_701[0]].next_announce.__d.__r =
           ((seconds32 *)(local_701._17_8_ + 0xe0))->__r + (int)now.__d.__r;
      (args_1->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>._M_elems
      [local_701[0]].min_announce.__d.__r =
           ((seconds32 *)(local_701._17_8_ + 0xe4))->__r + (int)now.__d.__r;
      (args_1->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>._M_elems
      [local_701[0]].field_0x44 = 0;
      (args_1->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>._M_elems
      [local_701[0]].last_error.val_ = 0;
      (args_1->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>._M_elems
      [local_701[0]].last_error.failed_ = false;
      (args_1->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>._M_elems
      [local_701[0]].last_error.cat_ =
           &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
      sVar8 = ((string *)(local_701._17_8_ + 0xc0))->_M_string_length;
      local_438._0_8_ = local_428;
      ptVar40 = (tracker_response *)local_701._17_8_;
      if (sVar8 == 0) {
        local_438._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_428[0] = '\0';
      }
      else {
        pcVar9 = (((string *)(local_701._17_8_ + 0xc0))->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>((string *)local_438,pcVar9,pcVar9 + sVar8);
      }
      ::std::__cxx11::string::_M_assign
                ((string *)
                 &(args_1->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>.
                  _M_elems[uVar41].message);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_438._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428) {
        operator_delete((void *)local_438._0_8_,CONCAT71(local_428._1_7_,local_428[0]) + 1);
      }
      tracker_list::record_working(&this->m_trackers,this_00);
      sVar38 = ((string *)(local_701._17_8_ + 0x80))->_M_string_length;
      if (sVar38 != 0) {
        args_4 = (string *)(local_701._17_8_ + 0x80);
        if ((this_00->trackerid)._M_string_length == sVar38) {
          iVar31 = bcmp((this_00->trackerid)._M_dataplus._M_p,(args_4->_M_dataplus)._M_p,sVar38);
          if (iVar31 == 0) goto LAB_00317e1c;
        }
        ::std::__cxx11::string::_M_assign((string *)&this_00->trackerid);
        iVar31 = (*(((torrent_hot_members *)(local_701._1_8_ + 8))->m_ses->super_session_logger).
                   _vptr_session_logger[5])();
        if ((*(uint *)(CONCAT44(extraout_var,iVar31) + 0x68) & 0x40) != 0) {
          local_6e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      CONCAT44(local_6e0._4_4_,now.__d.__r);
          iVar31 = (*(((torrent_hot_members *)(local_701._1_8_ + 8))->m_ses->super_session_logger).
                     _vptr_session_logger[5])();
          get_handle((torrent *)local_438);
          ptVar40 = (tracker_response *)local_701;
          alert_manager::
          emplace_alert<libtorrent::trackerid_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::protocol_version_const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
                    ((alert_manager *)CONCAT44(extraout_var_00,iVar31),(torrent_handle *)local_438,
                     &args_1->local_endpoint,(protocol_version *)ptVar40,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_701._25_8_,args_4);
          now.__d.__r = (duration)(duration)(rep_conflict)local_6e0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438._8_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              piVar1 = (int *)(local_438._8_8_ + 0xc);
              iVar31 = *piVar1;
              *piVar1 = *piVar1 + -1;
              UNLOCK();
            }
            else {
              iVar31 = *(int *)(local_438._8_8_ + 0xc);
              ptVar40 = (tracker_response *)(ulong)(iVar31 - 1U);
              *(uint *)(local_438._8_8_ + 0xc) = iVar31 - 1U;
            }
            if (iVar31 == 1) {
              (**(code **)(*(size_type *)local_438._8_8_ + 0x18))();
            }
          }
        }
      }
LAB_00317e1c:
      update_scrape_state((torrent *)local_701._1_8_);
    }
  }
  ptVar45 = (torrent *)local_701._1_8_;
  update_tracker_timer((torrent *)local_701._1_8_,now);
  iVar31 = (*(ptVar45->super_request_callback)._vptr_request_callback[6])(ptVar45);
  if ((char)iVar31 != '\0') {
    local_438._0_8_ = local_428;
    local_438._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_428[0] = '\0';
    paVar42 = extraout_RDX;
    p_Var33 = (_List_node_base *)tracker_ips;
    while (p_Var33 = (((_List_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                        *)&p_Var33->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var33 != (_List_node_base *)tracker_ips) {
      boost::asio::ip::address::to_string_abi_cxx11_((string *)local_578,(address *)(p_Var33 + 1));
      ::std::__cxx11::string::_M_append(local_438,local_578._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_578 + 0x10)) {
        operator_delete((void *)local_578._0_8_,local_578._16_8_ + 1);
      }
      ::std::__cxx11::string::append(local_438);
      paVar42 = extraout_RDX_00;
    }
    uVar30 = ((seconds32 *)(local_701._17_8_ + 0xe0))->__r;
    uVar4 = ((seconds32 *)(local_701._17_8_ + 0xe4))->__r;
    print_address_abi_cxx11_((string *)local_578,(aux *)local_701._9_8_,paVar42);
    uVar22 = local_438._0_8_;
    uVar21 = local_578._0_8_;
    print_address_abi_cxx11_((string *)&local_6a8,(aux *)local_6d8->_M_local_buf,addr);
    ptVar40 = (tracker_response *)(ulong)uVar4;
    (*((request_callback *)local_701._1_8_)->_vptr_request_callback[7])
              (local_701._1_8_,
               "TRACKER RESPONSE [ interval: %d | min-interval: %d | external ip: %s | resolved to: %s | we connected to: %s ]"
               ,(ulong)uVar30,ptVar40,uVar21,uVar22,local_6a8._0_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6a8._0_8_ != &local_698) {
      operator_delete((void *)local_6a8._0_8_,local_698._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_578._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_578 + 0x10)) {
      operator_delete((void *)local_578._0_8_,local_578._16_8_ + 1);
    }
    ptVar45 = (torrent *)local_701._1_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_438._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428) {
      operator_delete((void *)local_438._0_8_,CONCAT71(local_428._1_7_,local_428[0]) + 1);
    }
  }
  paVar48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(((vector<libtorrent::aux::peer_entry,_std::allocator<libtorrent::aux::peer_entry>_>
                  *)local_701._17_8_)->
               super__Vector_base<libtorrent::aux::peer_entry,_std::allocator<libtorrent::aux::peer_entry>_>
               )._M_impl.super__Vector_impl_data._M_start;
  paVar49 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(((vector<libtorrent::aux::peer_entry,_std::allocator<libtorrent::aux::peer_entry>_>
                  *)local_701._17_8_)->
               super__Vector_base<libtorrent::aux::peer_entry,_std::allocator<libtorrent::aux::peer_entry>_>
               )._M_impl.super__Vector_impl_data._M_finish;
  ptVar47 = (tracker_request *)local_701._25_8_;
  if (paVar48 != paVar49) {
    local_701._9_8_ = &ptVar45->super_enable_shared_from_this<libtorrent::aux::torrent>;
    local_6d8 = paVar49;
    do {
      auVar52[0] = -(*(char *)&((address *)(paVar48->_M_local_buf + 0x20))->type_ ==
                    (char)(ptVar45->m_peer_id).m_number._M_elems[0]);
      auVar52[1] = -(paVar48->_M_local_buf[0x21] ==
                    *(byte *)((long)(ptVar45->m_peer_id).m_number._M_elems + 1));
      auVar52[2] = -(paVar48->_M_local_buf[0x22] ==
                    *(byte *)((long)(ptVar45->m_peer_id).m_number._M_elems + 2));
      auVar52[3] = -(paVar48->_M_local_buf[0x23] ==
                    *(byte *)((long)(ptVar45->m_peer_id).m_number._M_elems + 3));
      auVar52[4] = -((char)(((address_v4 *)(paVar48->_M_local_buf + 0x24))->addr_).s_addr ==
                    (char)(ptVar45->m_peer_id).m_number._M_elems[1]);
      auVar52[5] = -(paVar48->_M_local_buf[0x25] ==
                    *(char *)((long)(ptVar45->m_peer_id).m_number._M_elems + 5));
      auVar52[6] = -(paVar48->_M_local_buf[0x26] ==
                    *(char *)((long)(ptVar45->m_peer_id).m_number._M_elems + 6));
      auVar52[7] = -(paVar48->_M_local_buf[0x27] ==
                    *(char *)((long)(ptVar45->m_peer_id).m_number._M_elems + 7));
      auVar52[8] = -((((address_v6 *)(paVar48->_M_local_buf + 0x28))->addr_).__in6_u.__u6_addr8[0]
                    == (uint8_t)(ptVar45->m_peer_id).m_number._M_elems[2]);
      auVar52[9] = -(paVar48->_M_local_buf[0x29] ==
                    *(char *)((long)(ptVar45->m_peer_id).m_number._M_elems + 9));
      auVar52[10] = -(paVar48->_M_local_buf[0x2a] ==
                     *(char *)((long)(ptVar45->m_peer_id).m_number._M_elems + 10));
      auVar52[0xb] = -(paVar48->_M_local_buf[0x2b] ==
                      *(char *)((long)(ptVar45->m_peer_id).m_number._M_elems + 0xb));
      auVar52[0xc] = -(paVar48->_M_local_buf[0x2c] ==
                      (char)(ptVar45->m_peer_id).m_number._M_elems[3]);
      auVar52[0xd] = -(paVar48->_M_local_buf[0x2d] ==
                      *(char *)((long)(ptVar45->m_peer_id).m_number._M_elems + 0xd));
      auVar52[0xe] = -(paVar48->_M_local_buf[0x2e] ==
                      *(char *)((long)(ptVar45->m_peer_id).m_number._M_elems + 0xe));
      auVar52[0xf] = -(paVar48->_M_local_buf[0x2f] ==
                      *(char *)((long)(ptVar45->m_peer_id).m_number._M_elems + 0xf));
      uVar30 = (ptVar45->m_peer_id).m_number._M_elems[4];
      uVar5 = *(undefined4 *)&((_List_node_base *)(paVar48->_M_local_buf + 0x30))->_M_next;
      auVar54[0] = -((char)uVar5 == (char)uVar30);
      auVar54[1] = -((char)((uint)uVar5 >> 8) == (char)(uVar30 >> 8));
      auVar54[2] = -((char)((uint)uVar5 >> 0x10) == (char)(uVar30 >> 0x10));
      auVar54[3] = -((char)((uint)uVar5 >> 0x18) == (char)(uVar30 >> 0x18));
      auVar54[4] = 0xff;
      auVar54[5] = 0xff;
      auVar54[6] = 0xff;
      auVar54[7] = 0xff;
      auVar54[8] = 0xff;
      auVar54[9] = 0xff;
      auVar54[10] = 0xff;
      auVar54[0xb] = 0xff;
      auVar54[0xc] = 0xff;
      auVar54[0xd] = 0xff;
      auVar54[0xe] = 0xff;
      auVar54[0xf] = 0xff;
      auVar54 = auVar54 & auVar52;
      if ((ushort)((ushort)(SUB161(auVar54 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar54 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar54 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar54 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar54 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar54 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar54 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar54 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar54 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar54 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar54 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar54 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar54 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar54 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar54 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar54[0xf] >> 7) << 0xf) != 0xffff) {
        if (ptVar47->i2pconn == (i2p_connection *)0x0) {
          iVar31 = (*(((ptVar45->super_torrent_hot_members).m_ses)->super_session_logger).
                     _vptr_session_logger[8])();
          ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<libtorrent::aux::torrent,void>
                    ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)local_438,
                     (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
                     local_701._9_8_);
          uVar22 = local_438._8_8_;
          uVar21 = local_438._0_8_;
          pVar25 = local_701[0];
          uVar3 = *(undefined2 *)(paVar48->_M_local_buf + 0x34);
          local_438._0_4_ = ipv4;
          local_438._4_4_ = 0;
          local_438._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_648 = (undefined1  [16])0x0;
          local_638._0_16_ = (undefined1  [16])0x0;
          puVar32 = (undefined8 *)operator_new(0x28);
          *puVar32 = on_peer_name_lookup;
          puVar32[1] = 0;
          *(protocol_version *)(puVar32 + 2) = pVar25;
          *(undefined2 *)((long)puVar32 + 0x12) = uVar3;
          puVar32[3] = uVar21;
          puVar32[4] = uVar22;
          local_648._0_8_ = puVar32;
          local_638._8_8_ =
               ::std::
               _Function_handler<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&),_std::_Bind<void_(libtorrent::aux::torrent::*(std::shared_ptr<libtorrent::aux::torrent>,_std::_Placeholder<1>,_std::_Placeholder<2>,_unsigned_short,_libtorrent::protocol_version))(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&,_int,_libtorrent::protocol_version)>_>
               ::_M_invoke;
          local_638._0_8_ =
               ::std::
               _Function_handler<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&),_std::_Bind<void_(libtorrent::aux::torrent::*(std::shared_ptr<libtorrent::aux::torrent>,_std::_Placeholder<1>,_std::_Placeholder<2>,_unsigned_short,_libtorrent::protocol_version))(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&,_int,_libtorrent::protocol_version)>_>
               ::_M_manager;
          ptVar40 = (tracker_response *)local_648;
          (*(code *)**(undefined8 **)CONCAT44(extraout_var_01,iVar31))
                    ((undefined8 *)CONCAT44(extraout_var_01,iVar31),paVar48,2);
          paVar49 = local_6d8;
          ptVar47 = (tracker_request *)local_701._25_8_;
          ptVar45 = (torrent *)local_701._1_8_;
          if ((pointer)local_638._0_8_ != (pointer)0x0) {
            (*(code *)local_638._0_8_)(local_648,local_648,3);
          }
          paVar46 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_438._8_8_;
        }
        else {
          s2._M_str = ".i2p";
          s2._M_len = 4;
          s1._M_str = (char *)paVar48->_M_allocated_capacity;
          s1._M_len = (size_t)*(_List_node_base **)
                               &(((address_v6 *)((long)paVar48 + 8))->addr_).__in6_u;
          bVar29 = string_ends_with(s1,s2);
          if (!bVar29) {
            get_peer_list_state((torrent_state *)local_438,ptVar45);
            need_peer_list(ptVar45);
            ptVar40 = (tracker_response *)0x1;
            destination_00._M_str = (char *)paVar48->_M_allocated_capacity;
            destination_00._M_len =
                 (size_t)*(_List_node_base **)&(((address_v6 *)((long)paVar48 + 8))->addr_).__in6_u;
            ptVar35 = peer_list::add_i2p_peer
                                ((ptVar45->super_torrent_hot_members).m_peer_list._M_t.
                                 super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
                                 .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>.
                                 _M_head_impl,destination_00,(peer_source_flags_t)0x1,
                                 (pex_flags_t)0x0,(torrent_state *)local_438);
            if (ptVar35 != (torrent_peer *)0x0) {
              state_updated(ptVar45);
            }
            peVar28 = local_398;
            peVar24 = local_3a0;
            if ((ptVar45->super_torrent_hot_members).m_picker._M_t.
                super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                ._M_t.
                super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl !=
                (piece_picker *)0x0) {
              for (; peVar24 != peVar28;
                  peVar24 = (element_type *)&peVar24->super_torrent_hot_members) {
                piece_picker::clear_peer
                          ((ptVar45->super_torrent_hot_members).m_picker._M_t.
                           super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                           .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                           _M_head_impl,
                           (torrent_peer *)(peVar24->super_request_callback)._vptr_request_callback)
                ;
              }
            }
            if (local_3a0 != (element_type *)0x0) {
              operator_delete(local_3a0,(long)local_390._M_pi - (long)local_3a0);
            }
            goto LAB_003183fb;
          }
          paVar49 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)ptVar47->i2pconn;
          pcVar37 = *(char **)paVar48;
          ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<libtorrent::aux::torrent,void>
                    ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)local_6b8,
                     (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
                     local_701._9_8_);
          if ((((*(int *)&((_List_node_base *)(paVar49->_M_local_buf + 0x90))->_M_next == 2) &&
               (*(_List_node_base **)(paVar49->_M_local_buf + 0x78) ==
                (_List_node_base *)(paVar49->_M_local_buf + 0x78))) &&
              (paVar49->_M_allocated_capacity != 0)) &&
             (*(int *)(paVar49->_M_allocated_capacity + 8) != -1)) {
            ::std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_5e0,pcVar37,(allocator<char> *)local_600);
            auVar27 = local_5e0;
            uVar21 = local_6b8._0_8_;
            local_6e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6b8._8_8_;
            local_6b8 = (undefined1  [16])0x0;
            *(undefined4 *)&((_List_node_base *)(paVar49->_M_local_buf + 0x90))->_M_next = 1;
            sVar8 = paVar49->_M_allocated_capacity;
            pcVar37 = *(char **)(sVar8 + 0x140);
            strlen((char *)local_5e0);
            ::std::__cxx11::string::_M_replace(sVar8 + 0x138,0,pcVar37,(ulong)auVar27);
            ptVar45 = (torrent *)local_701._1_8_;
            paVar46 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)paVar49->_M_allocated_capacity;
            p_Var10 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                       &(((address_v6 *)((long)paVar49 + 8))->addr_).__in6_u;
            if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
              }
            }
            paVar46->_M_local_buf[0x169] = '\x04';
            local_490 = paVar49;
            uVar30 = snprintf(local_438,0x400,"NAMING LOOKUP NAME=%s\n",
                              *(_List_node_base **)(paVar46->_M_local_buf + 0x138));
            if (0x3ff < uVar30) {
              uVar30 = 0x400;
            }
            local_578._16_8_ = ZEXT48(uVar30);
            local_478 = 0;
            uStack_470 = 0;
            local_488 = (i2p_connection *)0x0;
            uStack_480 = 0;
            aStack_5a8._8_8_ = 0;
            aStack_598._M_allocated_capacity = 0;
            _local_5b0 = (undefined1  [16])0x0;
            local_578._8_8_ = local_438;
            local_560._0_8_ = 0;
            local_560.__u6_addr32[2] = 0;
            local_698 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         )0x0;
            local_530 = (element_type *)uVar21;
            local_528._M_pi = local_6e0;
            local_688 = (undefined1  [16])0x0;
            local_460 = (i2p_connection *)((ulong)local_460 & 0xffffff0000000000);
            local_458._0_8_ = &boost::system::detail::cat_holder<void>::system_category_instance;
            ptVar40 = (tracker_response *)0x1;
            local_6a8._0_8_ = paVar46;
            local_6a8._8_8_ = paVar49;
            local_5b8 = (undefined1  [8])paVar49;
            local_578._0_8_ = paVar46;
            local_550.this = (i2p_stream *)paVar46;
            local_548 = paVar49;
            local_540._0_8_ = paVar46;
            local_540._8_8_ = p_Var10;
            boost::asio::detail::
            write_op<libtorrent::aux::noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_libtorrent::aux::wrap_allocator_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/include/libtorrent/i2p_stream.hpp:151:4),_libtorrent::aux::wrap_allocator_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/include/libtorrent/i2p_stream.hpp:558:4),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:3614:9)>_>_>
            ::operator()((write_op<libtorrent::aux::noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_libtorrent::aux::wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:151:4),_libtorrent::aux::wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:558:4),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:3614:9)>_>_>
                          *)local_578,(error_code *)&local_460,0,1);
            paVar49 = local_6d8;
            ptVar47 = (tracker_request *)local_701._25_8_;
            if (local_528._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_528._M_pi);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_540._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_540._8_8_);
            }
            if (local_5e0 != (undefined1  [8])(local_5d8 + 8)) {
              operator_delete((void *)local_5e0,local_5d8._8_8_ + 1);
            }
          }
          else {
            ::std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_438,pcVar37,(allocator<char> *)local_578);
            p_Var33 = (_List_node_base *)operator_new(0x50);
            local_6e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(p_Var33 + 2);
            p_Var33[1]._M_next = (_List_node_base *)local_6e0;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_438._0_8_ ==
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428) {
              local_6e0->_vptr__Sp_counted_base =
                   (_func_int **)CONCAT71(local_428._1_7_,local_428[0]);
              p_Var33[2]._M_prev = (_List_node_base *)aStack_420._0_8_;
            }
            else {
              p_Var33[1]._M_next = (_List_node_base *)local_438._0_8_;
              p_Var33[2]._M_next = (_List_node_base *)CONCAT71(local_428._1_7_,local_428[0]);
              local_6e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_438._0_8_;
            }
            p_Var33[1]._M_prev = (_List_node_base *)local_438._8_8_;
            local_438._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_428[0] = '\0';
            p_Var33[4]._M_next = (_List_node_base *)0x0;
            p_Var33[4]._M_prev = (_List_node_base *)0x0;
            p_Var33[3]._M_next = (_List_node_base *)0x0;
            p_Var33[3]._M_prev = (_List_node_base *)0x0;
            local_438._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428;
            p_Var34 = (_List_node_base *)operator_new(0x10);
            ptVar40 = (tracker_response *)0x0;
            p_Var34->_M_next = (_List_node_base *)local_6b8._0_8_;
            p_Var34->_M_prev = (_List_node_base *)local_6b8._8_8_;
            local_6b8 = ZEXT816(0);
            p_Var33[3]._M_next = p_Var34;
            p_Var33[4]._M_prev =
                 (_List_node_base *)
                 ::std::
                 _Function_handler<void_(const_boost::system::error_code_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:3614:9)>
                 ::_M_invoke;
            p_Var33[4]._M_next =
                 (_List_node_base *)
                 ::std::
                 _Function_handler<void_(const_boost::system::error_code_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:3614:9)>
                 ::_M_manager;
            ::std::__detail::_List_node_base::_M_hook(p_Var33);
            *(_List_node_base **)&(((address_v6 *)(paVar49->_M_local_buf + 0x88))->addr_).__in6_u =
                 (_List_node_base *)
                 ((long)&(*(_List_node_base **)
                           &(((address_v6 *)(paVar49->_M_local_buf + 0x88))->addr_).__in6_u)->
                         _M_next + 1);
            ptVar45 = (torrent *)local_701._1_8_;
            ptVar47 = (tracker_request *)local_701._25_8_;
            paVar49 = local_6d8;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_438._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428) {
              operator_delete((void *)local_438._0_8_,CONCAT71(local_428._1_7_,local_428[0]) + 1);
              ptVar45 = (torrent *)local_701._1_8_;
              ptVar47 = (tracker_request *)local_701._25_8_;
              paVar49 = local_6d8;
            }
          }
          paVar46 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_6b8._8_8_;
        }
        if (paVar46 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)paVar46);
        }
      }
LAB_003183fb:
      paVar48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(paVar48->_M_local_buf + 0x38);
    } while (paVar48 != paVar49);
  }
  if (ptVar47->i2pconn != (i2p_connection *)0x0) {
    paVar48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(((vector<libtorrent::aux::i2p_peer_entry,_std::allocator<libtorrent::aux::i2p_peer_entry>_>
                    *)(local_701._17_8_ + 0x48))->
                 super__Vector_base<libtorrent::aux::i2p_peer_entry,_std::allocator<libtorrent::aux::i2p_peer_entry>_>
                 )._M_impl.super__Vector_impl_data._M_start;
    local_6d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(((vector<libtorrent::aux::i2p_peer_entry,_std::allocator<libtorrent::aux::i2p_peer_entry>_>
                      *)(local_701._17_8_ + 0x48))->
                   super__Vector_base<libtorrent::aux::i2p_peer_entry,_std::allocator<libtorrent::aux::i2p_peer_entry>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
    if (paVar48 != local_6d8) {
      local_6e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  &ptVar45->super_enable_shared_from_this<libtorrent::aux::torrent>;
      do {
        get_peer_list_state((torrent_state *)local_578,ptVar45);
        _local_5b0 = (unkuint9)0;
        aStack_598._M_allocated_capacity = 0;
        aStack_598._8_8_ = 0;
        local_588 = 0;
        s.m_len = (difference_type)ptVar40;
        s.m_ptr = (char *)0x20;
        local_5b8 = (undefined1  [8])(local_5b0 + 8);
        base32encode_i2p_abi_cxx11_(&local_620,(libtorrent *)paVar48->_M_local_buf,s);
        ::std::__cxx11::string::append((char *)&local_620);
        __s._M_p = local_620._M_dataplus._M_p;
        piVar11 = ptVar47->i2pconn;
        ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<libtorrent::aux::torrent,void>
                  ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)local_6c8,
                   (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)local_6e0);
        if (((piVar11->m_state == sam_idle) &&
            ((piVar11->m_name_lookup).
             super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>_>_>
             ._M_impl._M_node.super__List_node_base._M_next ==
             (_List_node_base *)&piVar11->m_name_lookup)) &&
           ((peVar12 = (piVar11->m_sam_socket).
                       super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            , peVar12 != (element_type *)0x0 &&
            ((peVar12->super_proxy_base).m_sock.
             super_noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
             .
             super_basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
             .
             super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
             .impl_.implementation_.super_base_implementation_type.socket_ != -1)))) {
          ::std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_600,__s._M_p,&local_6c9);
          piVar26 = local_600[0];
          uVar21 = local_6c8._0_8_;
          local_701._9_8_ = local_6c8._8_8_;
          local_6c8 = (undefined1  [16])0x0;
          piVar11->m_state = sam_name_lookup;
          peVar12 = (piVar11->m_sam_socket).
                    super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          pcVar37 = (char *)(peVar12->m_name_lookup)._M_string_length;
          strlen((char *)local_600[0]);
          ::std::__cxx11::string::_M_replace
                    ((ulong)&peVar12->m_name_lookup,0,pcVar37,(ulong)piVar26);
          ptVar45 = (torrent *)local_701._1_8_;
          paVar49 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(piVar11->m_sam_socket).
                       super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          ;
          p_Var10 = (piVar11->m_sam_socket).
                    super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
            }
          }
          paVar49->_M_local_buf[0x169] = '\x04';
          local_460 = piVar11;
          uVar30 = snprintf(local_438,0x400,"NAMING LOOKUP NAME=%s\n",
                            *(_List_node_base **)(paVar49->_M_local_buf + 0x138));
          if (0x3ff < uVar30) {
            uVar30 = 0x400;
          }
          local_448 = (undefined1  [16])0x0;
          local_458 = (undefined1  [16])0x0;
          local_5c8 = (undefined1  [16])0x0;
          local_5d8 = (undefined1  [16])0x0;
          local_6a8._8_8_ = local_438;
          local_698 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       )ZEXT416(uVar30);
          local_688._0_8_ = local_688._4_8_ << 0x20;
          local_688._8_8_ = paVar49;
          uStack_480 = 0;
          local_478 = 0;
          local_660 = uVar21;
          local_658 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_701._9_8_;
          uStack_470 = 0;
          uStack_468 = 0;
          local_4c8.val_ = 0;
          local_4c8.failed_ = false;
          local_4c8.cat_ =
               &boost::system::detail::cat_holder<void>::system_category_instance.
                super_error_category;
          ptVar40 = (tracker_response *)0x1;
          local_6a8._0_8_ = paVar49;
          local_678 = piVar11;
          local_670 = paVar49;
          local_668 = p_Var10;
          local_5e0 = (undefined1  [8])piVar11;
          local_490 = paVar49;
          local_488 = piVar11;
          boost::asio::detail::
          write_op<libtorrent::aux::noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_libtorrent::aux::wrap_allocator_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/include/libtorrent/i2p_stream.hpp:151:4),_libtorrent::aux::wrap_allocator_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/include/libtorrent/i2p_stream.hpp:558:4),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:3647:8)>_>_>
          ::operator()((write_op<libtorrent::aux::noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_libtorrent::aux::wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:151:4),_libtorrent::aux::wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:558:4),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:3647:8)>_>_>
                        *)&local_6a8,&local_4c8,0,1);
          ptVar47 = (tracker_request *)local_701._25_8_;
          if (local_658 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_658);
          }
          if (local_668 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_668);
          }
          if (local_600[0] != &local_5f0) {
            operator_delete(local_600[0],
                            (ulong)&(local_5f0.super_execution_context.service_registry_)->field_0x1
                           );
          }
        }
        else {
          ::std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_438,__s._M_p,(allocator<char> *)local_6a8.__u6_addr8);
          local_701._9_8_ = paVar48;
          p_Var33 = (_List_node_base *)operator_new(0x50);
          p_Var33[1]._M_next = p_Var33 + 2;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_438._0_8_ ==
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428) {
            p_Var33[2]._M_next = (_List_node_base *)CONCAT71(local_428._1_7_,local_428[0]);
            p_Var33[2]._M_prev = (_List_node_base *)aStack_420._0_8_;
          }
          else {
            p_Var33[1]._M_next = (_List_node_base *)local_438._0_8_;
            p_Var33[2]._M_next = (_List_node_base *)CONCAT71(local_428._1_7_,local_428[0]);
          }
          p_Var33[1]._M_prev = (_List_node_base *)local_438._8_8_;
          local_438._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_428[0] = '\0';
          p_Var33[4]._M_next = (_List_node_base *)0x0;
          p_Var33[4]._M_prev = (_List_node_base *)0x0;
          p_Var33[3]._M_next = (_List_node_base *)0x0;
          p_Var33[3]._M_prev = (_List_node_base *)0x0;
          local_438._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428;
          p_Var34 = (_List_node_base *)operator_new(0x10);
          ptVar40 = (tracker_response *)0x0;
          p_Var34->_M_next = (_List_node_base *)local_6c8._0_8_;
          p_Var34->_M_prev = (_List_node_base *)local_6c8._8_8_;
          local_6c8 = ZEXT816(0);
          p_Var33[3]._M_next = p_Var34;
          p_Var33[4]._M_prev =
               (_List_node_base *)
               ::std::
               _Function_handler<void_(const_boost::system::error_code_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:3647:8)>
               ::_M_invoke;
          p_Var33[4]._M_next =
               (_List_node_base *)
               ::std::
               _Function_handler<void_(const_boost::system::error_code_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:3647:8)>
               ::_M_manager;
          ::std::__detail::_List_node_base::_M_hook(p_Var33);
          psVar2 = &(piVar11->m_name_lookup).
                    super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>_>_>
                    ._M_impl._M_node._M_size;
          *psVar2 = *psVar2 + 1;
          ptVar45 = (torrent *)local_701._1_8_;
          ptVar47 = (tracker_request *)local_701._25_8_;
          paVar48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_701._9_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_438._0_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428) {
            operator_delete((void *)local_438._0_8_,CONCAT71(local_428._1_7_,local_428[0]) + 1);
            ptVar45 = (torrent *)local_701._1_8_;
            ptVar47 = (tracker_request *)local_701._25_8_;
            paVar48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_701._9_8_;
          }
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6c8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6c8._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_620._M_dataplus._M_p != &local_620.field_2) {
          operator_delete(local_620._M_dataplus._M_p,
                          (ulong)(local_620.field_2._M_allocated_capacity + 1));
        }
        if (local_5b8 != (undefined1  [8])(local_5b0 + 8)) {
          operator_delete((void *)local_5b8,(ulong)(aStack_5a8._0_8_ + 1));
        }
        if (local_4e0 != (pointer)0x0) {
          operator_delete(local_4e0,(long)local_4d0 - (long)local_4e0);
        }
        paVar48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar48->_M_local_buf + 0x20);
      } while (paVar48 != local_6d8);
    }
  }
  uVar21 = local_701._1_8_;
  flags.m_val = (local_701[0] == V2) << 7;
  piVar43 = (((vector<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
               *)(local_701._17_8_ + 0x18))->
            super__Vector_base<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
            )._M_impl.super__Vector_impl_data._M_start;
  piVar13 = (((vector<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
               *)(local_701._17_8_ + 0x18))->
            super__Vector_base<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  bVar29 = false;
  if (piVar43 != piVar13) {
    do {
      local_438._4_4_ = *(undefined4 *)(piVar43->ip)._M_elems;
      local_438._0_4_ = ipv4;
      local_438._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_428[0] = '\0';
      local_428._1_7_ = 0;
      aStack_420._0_8_ = (element_type *)0x0;
      boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
                ((basic_endpoint<boost::asio::ip::tcp> *)local_578,(address *)local_438,
                 piVar43->port);
      ptVar35 = add_peer((torrent *)uVar21,(basic_endpoint<boost::asio::ip::tcp> *)local_578,
                         (peer_source_flags_t)0x1,flags);
      bVar29 = (bool)(bVar29 | ptVar35 != (torrent_peer *)0x0);
      piVar43 = piVar43 + 1;
    } while (piVar43 != piVar13);
  }
  ptVar45 = (torrent *)local_701._1_8_;
  piVar44 = (((vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
               *)(local_701._17_8_ + 0x30))->
            super__Vector_base<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
            )._M_impl.super__Vector_impl_data._M_start;
  piVar14 = (((vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
               *)(local_701._17_8_ + 0x30))->
            super__Vector_base<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (piVar44 != piVar14) {
    do {
      local_6a8._0_8_ = *(undefined8 *)(piVar44->ip)._M_elems;
      local_6a8._8_8_ = *(undefined8 *)((piVar44->ip)._M_elems + 8);
      local_438._0_4_ = ipv6;
      local_438._4_4_ = 0;
      local_428[0] = (undefined1)local_6a8._8_8_;
      local_428._1_7_ = (undefined7)((ulong)local_6a8._8_8_ >> 8);
      aStack_420._0_8_ = (element_type *)0x0;
      local_438._8_8_ = local_6a8._0_8_;
      boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
                ((basic_endpoint<boost::asio::ip::tcp> *)local_578,(address *)local_438,
                 piVar44->port);
      ptVar35 = add_peer(ptVar45,(basic_endpoint<boost::asio::ip::tcp> *)local_578,
                         (peer_source_flags_t)0x1,flags);
      bVar29 = (bool)(bVar29 | ptVar35 != (torrent_peer *)0x0);
      piVar44 = piVar44 + 1;
    } while (piVar44 != piVar14);
  }
  iVar31 = (*(ptVar45->super_request_callback)._vptr_request_callback[6])(ptVar45);
  ptVar47 = (tracker_request *)local_701._25_8_;
  if ((char)iVar31 != '\0') {
    piVar43 = (((vector<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
                 *)(local_701._17_8_ + 0x18))->
              super__Vector_base<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
              )._M_impl.super__Vector_impl_data._M_start;
    piVar13 = (((vector<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
                 *)(local_701._17_8_ + 0x18))->
              super__Vector_base<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (piVar43 == piVar13) {
      ptVar45 = (torrent *)local_701._1_8_;
      if ((((vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
             *)(local_701._17_8_ + 0x30))->
          super__Vector_base<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
          )._M_impl.super__Vector_impl_data._M_start ==
          (((vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
             *)(local_701._17_8_ + 0x30))->
          super__Vector_base<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
          )._M_impl.super__Vector_impl_data._M_finish) goto LAB_00318dc7;
      local_701._9_8_ = local_578 + 0x10;
      local_578[8] = '\0';
      local_578[9] = '\0';
      local_578[10] = '\0';
      local_578[0xb] = '\0';
      local_578[0xc] = '\0';
      local_578[0xd] = '\0';
      local_578[0xe] = '\0';
      local_578[0xf] = '\0';
      local_578._16_8_ = (ulong)(uint7)local_578._17_7_ << 8;
      local_578._0_8_ = local_701._9_8_;
    }
    else {
      local_701._9_8_ = local_578 + 0x10;
      local_578[8] = '\0';
      local_578[9] = '\0';
      local_578[10] = '\0';
      local_578[0xb] = '\0';
      local_578[0xc] = '\0';
      local_578[0xd] = '\0';
      local_578[0xe] = '\0';
      local_578[0xf] = '\0';
      local_578._16_8_ = (ulong)(uint7)local_578._17_7_ << 8;
      local_578._0_8_ = local_701._9_8_;
      puVar36 = (uint *)__errno_location();
      do {
        local_490 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_490._4_4_,*(undefined4 *)(piVar43->ip)._M_elems);
        *puVar36 = 0;
        pcVar37 = inet_ntop(2,&local_490,local_5b8,0x10);
        if (pcVar37 == (char *)0x0) {
          uVar30 = *puVar36;
          ::std::runtime_error::runtime_error((runtime_error *)local_438,"");
          uVar41 = 0x100000016;
          if ((ulong)uVar30 != 0) {
            uVar41 = (ulong)uVar30 | 0x100000000;
          }
          aStack_420._8_8_ = local_408;
          local_438._0_4_ = 0x4dec78;
          local_438._4_4_ = 0;
          local_428[0] = (undefined1)uVar41;
          local_428._1_7_ = (undefined7)(uVar41 >> 8);
          aStack_420._0_8_ = &boost::system::detail::cat_holder<void>::system_category_instance;
          local_410 = 0;
          local_408[0]._M_local_buf[0] = ipv4;
          boost::throw_exception<boost::system::system_error>((system_error *)local_438);
        }
        local_6a8._0_8_ = &local_698;
        sVar38 = strlen(pcVar37);
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_6a8,pcVar37,pcVar37 + sVar38);
        ::std::__cxx11::string::_M_append(local_578,local_6a8._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6a8._0_8_ != &local_698) {
          operator_delete((void *)local_6a8._0_8_,local_698._M_allocated_capacity + 1);
        }
        ::std::__cxx11::string::push_back((char)local_578);
        piVar43 = piVar43 + 1;
      } while (piVar43 != piVar13);
    }
    piVar44 = (((vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
                 *)(local_701._17_8_ + 0x30))->
              super__Vector_base<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
              )._M_impl.super__Vector_impl_data._M_start;
    piVar14 = (((vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
                 *)(local_701._17_8_ + 0x30))->
              super__Vector_base<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (piVar44 != piVar14) {
      do {
        auVar23._8_8_ = 0;
        auVar23._0_8_ = local_698._8_8_;
        local_698 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     )(auVar23 << 0x40);
        local_6a8._0_8_ = *(undefined8 *)(piVar44->ip)._M_elems;
        local_6a8._8_8_ = *(undefined8 *)((piVar44->ip)._M_elems + 8);
        boost::asio::ip::address_v6::to_string_abi_cxx11_
                  ((string *)local_438,(address_v6 *)&local_6a8);
        ::std::__cxx11::string::_M_append(local_578,local_438._0_8_);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_438._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428) {
          operator_delete((void *)local_438._0_8_,CONCAT71(local_428._1_7_,local_428[0]) + 1);
        }
        ::std::__cxx11::string::push_back((char)local_578);
        piVar44 = piVar44 + 1;
      } while (piVar44 != piVar14);
    }
    ptVar47 = (tracker_request *)local_701._25_8_;
    uVar21 = local_701._9_8_;
    ptVar45 = (torrent *)local_701._1_8_;
    ppVar15 = (((torrent_hot_members *)(local_701._1_8_ + 8))->m_peer_list)._M_t.
              super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
              ._M_t.
              super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
              .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl;
    if (ppVar15 == (peer_list *)0x0) {
      uVar41 = 0xffffffff;
    }
    else {
      uVar41 = (ulong)(uint)ppVar15->m_num_connect_candidates;
    }
    (*((request_callback *)local_701._1_8_)->_vptr_request_callback[7])
              (local_701._1_8_,"tracker add_peer() [ %s] connect-candidates: %d",local_578._0_8_,
               uVar41);
    if (local_578._0_8_ != uVar21) {
      operator_delete((void *)local_578._0_8_,local_578._16_8_ + 1);
    }
  }
LAB_00318dc7:
  if (bVar29) {
    state_updated(ptVar45);
  }
  update_want_peers(ptVar45);
  iVar31 = (*(((ptVar45->super_torrent_hot_members).m_ses)->super_session_logger).
             _vptr_session_logger[5])();
  uVar21 = local_701._17_8_;
  if (((*(uint *)(CONCAT44(extraout_var_02,iVar31) + 0x68) & 0x10) != 0) ||
     (ptVar47->triggered_manually == true)) {
    ppVar16 = (((vector<libtorrent::aux::peer_entry,_std::allocator<libtorrent::aux::peer_entry>_> *
                )local_701._17_8_)->
              super__Vector_base<libtorrent::aux::peer_entry,_std::allocator<libtorrent::aux::peer_entry>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    piVar43 = (((vector<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
                 *)(local_701._17_8_ + 0x18))->
              super__Vector_base<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    ppVar17 = (((vector<libtorrent::aux::peer_entry,_std::allocator<libtorrent::aux::peer_entry>_> *
                )local_701._17_8_)->
              super__Vector_base<libtorrent::aux::peer_entry,_std::allocator<libtorrent::aux::peer_entry>_>
              )._M_impl.super__Vector_impl_data._M_start;
    piVar13 = (((vector<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
                 *)(local_701._17_8_ + 0x18))->
              super__Vector_base<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
              )._M_impl.super__Vector_impl_data._M_start;
    piVar18 = (((vector<libtorrent::aux::i2p_peer_entry,_std::allocator<libtorrent::aux::i2p_peer_entry>_>
                 *)(local_701._17_8_ + 0x48))->
              super__Vector_base<libtorrent::aux::i2p_peer_entry,_std::allocator<libtorrent::aux::i2p_peer_entry>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    piVar19 = (((vector<libtorrent::aux::i2p_peer_entry,_std::allocator<libtorrent::aux::i2p_peer_entry>_>
                 *)(local_701._17_8_ + 0x48))->
              super__Vector_base<libtorrent::aux::i2p_peer_entry,_std::allocator<libtorrent::aux::i2p_peer_entry>_>
              )._M_impl.super__Vector_impl_data._M_start;
    iVar31 = (*(((ptVar45->super_torrent_hot_members).m_ses)->super_session_logger).
               _vptr_session_logger[5])();
    get_handle((torrent *)local_438);
    local_578._0_4_ =
         (int)((ulong)((long)(((vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
                                *)(uVar21 + 0x30))->
                             super__Vector_base<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(((vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
                               *)(uVar21 + 0x30))->
                            super__Vector_base<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
                            )._M_impl.super__Vector_impl_data._M_start) >> 1) * 0x38e38e39 +
         (int)((ulong)((long)piVar18 - (long)piVar19) >> 5) +
         (int)((ulong)((long)piVar43 - (long)piVar13) >> 1) * -0x55555555 +
         (int)((ulong)((long)ppVar16 - (long)ppVar17) >> 3) * -0x49249249;
    alert_manager::
    emplace_alert<libtorrent::tracker_reply_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,int,libtorrent::protocol_version_const&,std::__cxx11::string_const&>
              ((alert_manager *)CONCAT44(extraout_var_03,iVar31),(torrent_handle *)local_438,
               (basic_endpoint<boost::asio::ip::tcp> *)&local_4b8.base,(int *)local_578,local_701,
               &ptVar47->url);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._8_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar1 = (int *)(local_438._8_8_ + 0xc);
        iVar31 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
      }
      else {
        iVar31 = *(int *)(local_438._8_8_ + 0xc);
        *(int *)(local_438._8_8_ + 0xc) = iVar31 + -1;
      }
      if (iVar31 == 1) {
        (**(code **)(*(size_type *)local_438._8_8_ + 0x18))();
      }
    }
  }
  do_connect_boost(ptVar45);
  state_updated(ptVar45);
  return;
}

Assistant:

void torrent::tracker_response(
		tracker_request const& r
		, address const& tracker_ip // this is the IP we connected to
		, std::list<address> const& tracker_ips // these are all the IPs it resolved to
		, struct tracker_response const& resp)
	{
		TORRENT_ASSERT(is_single_thread());

		INVARIANT_CHECK;
		TORRENT_ASSERT(!(r.kind & tracker_request::scrape_request));

		// if the tracker told us what our external IP address is, record it with
		// out external IP counter (and pass along the IP of the tracker to know
		// who to attribute this vote to)
		if (resp.external_ip != address() && !tracker_ip.is_unspecified() && r.outgoing_socket)
			m_ses.set_external_address(r.outgoing_socket.get_local_endpoint()
				, resp.external_ip
				, aux::session_interface::source_tracker, tracker_ip);

		time_point32 const now = aux::time_now32();

		protocol_version const v = r.info_hash == torrent_file().info_hashes().v1
			? protocol_version::V1 : protocol_version::V2;

		// TODO: move this into a function on tracker_list
		aux::announce_entry* ae = m_trackers.find_tracker(r.url);

		tcp::endpoint local_endpoint;
		if (ae)
		{
			auto* aep = ae->find_endpoint(r.outgoing_socket);
			if (aep)
			{
				auto& a = aep->info_hashes[v];

				local_endpoint = aep->local_endpoint;
				if (resp.incomplete >= 0) a.scrape_incomplete = resp.incomplete;
				if (resp.complete >= 0) a.scrape_complete = resp.complete;
				if (resp.downloaded >= 0) a.scrape_downloaded = resp.downloaded;
				if (!a.start_sent && r.event == event_t::started)
					a.start_sent = true;
				if (!a.complete_sent && r.event == event_t::completed)
				{
					a.complete_sent = true;
					// we successfully reported event=completed to one tracker. Don't
					// send it to any other ones from now on (there may be other
					// announces outstanding right now though)
					m_complete_sent = true;
				}
				ae->verified = true;
				a.next_announce = now + resp.interval;
				a.min_announce = now + resp.min_interval;
				a.updating = false;
				a.fails = 0;
				a.last_error.clear();
				a.message = !resp.warning_message.empty() ? resp.warning_message : std::string();
				m_trackers.record_working(ae);

				if ((!resp.trackerid.empty()) && (ae->trackerid != resp.trackerid))
				{
					ae->trackerid = resp.trackerid;
					if (m_ses.alerts().should_post<trackerid_alert>())
						m_ses.alerts().emplace_alert<trackerid_alert>(get_handle()
							, aep->local_endpoint, v, r.url, resp.trackerid);
				}

				update_scrape_state();
			}
		}
		update_tracker_timer(now);

#if TORRENT_ABI_VERSION == 1
		if (resp.complete >= 0 && resp.incomplete >= 0)
			m_last_scrape = aux::time_now32();
#endif

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			std::string resolved_to;
			for (auto const& i : tracker_ips)
			{
				resolved_to += i.to_string();
				resolved_to += ", ";
			}
			debug_log("TRACKER RESPONSE [ interval: %d | min-interval: %d | "
				"external ip: %s | resolved to: %s | we connected to: %s ]"
				, resp.interval.count()
				, resp.min_interval.count()
				, print_address(resp.external_ip).c_str()
				, resolved_to.c_str()
				, print_address(tracker_ip).c_str());
		}
#else
		TORRENT_UNUSED(tracker_ips);
#endif

		// for each of the peers we got from the tracker
		for (auto const& i : resp.peers)
		{
			// don't make connections to ourself
			if (i.pid == m_peer_id)
				continue;

#if TORRENT_USE_I2P
			if (r.i2pconn)
			{
				// this is an i2p name, we need to use the SAM connection
				// to do the name lookup
				if (string_ends_with(i.hostname, ".i2p"))
				{
					ADD_OUTSTANDING_ASYNC("torrent::on_i2p_resolve");
					r.i2pconn->async_name_lookup(i.hostname.c_str()
						, [self = shared_from_this()] (error_code const& ec, char const* dest)
						{ self->torrent::on_i2p_resolve(ec, dest); });
				}
				else
				{
					torrent_state st = get_peer_list_state();
					need_peer_list();
					if (m_peer_list->add_i2p_peer(i.hostname, peer_info::tracker, {}, &st))
						state_updated();
					peers_erased(st.erased);
				}
			}
			else
#endif
			{
				ADD_OUTSTANDING_ASYNC("torrent::on_peer_name_lookup");
				m_ses.get_resolver().async_resolve(i.hostname, aux::resolver_interface::abort_on_shutdown
					, std::bind(&torrent::on_peer_name_lookup, shared_from_this(), _1, _2, i.port, v));
			}
		}

#if TORRENT_USE_I2P
		if (r.i2pconn)
		{
			for (auto const& i : resp.i2p_peers)
			{
				torrent_state st = get_peer_list_state();
				peer_entry p;
				std::string destination = base32encode_i2p(i.destination);
				destination += ".b32.i2p";

				ADD_OUTSTANDING_ASYNC("torrent::on_i2p_resolve");
				r.i2pconn->async_name_lookup(destination.c_str()
					, [self = shared_from_this()] (error_code const& ec, char const* dest)
					{ self->torrent::on_i2p_resolve(ec, dest); });
			}
		}
#endif

		// there are 2 reasons to allow local IPs to be returned from a
		// non-local tracker
		// 1. retrackers are popular in russia, where an ISP runs a tracker within
		//    the AS (but not on the local network) giving out peers only from the
		//    local network
		// 2. it might make sense to have a tracker extension in the future where
		//    trackers records a peer's internal and external IP, and match up
		//    peers on the same local network

		pex_flags_t flags = v == protocol_version::V2 ? pex_lt_v2 : pex_flags_t(0);

		bool need_update = false;
		for (auto const& i : resp.peers4)
		{
			tcp::endpoint const a(address_v4(i.ip), i.port);
			need_update |= bool(add_peer(a, peer_info::tracker, flags) != nullptr);
		}

		for (auto const& i : resp.peers6)
		{
			tcp::endpoint const a(address_v6(i.ip), i.port);
			need_update |= bool(add_peer(a, peer_info::tracker, flags) != nullptr);
		}

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log() && (!resp.peers4.empty() || !resp.peers6.empty()))
		{
			std::string str;
			for (auto const& peer : resp.peers4)
			{
				str += address_v4(peer.ip).to_string();
				str += ' ';
			}
			for (auto const& peer : resp.peers6)
			{
				str += address_v6(peer.ip).to_string();
				str += ' ';
			}
			debug_log("tracker add_peer() [ %s] connect-candidates: %d"
				, str.c_str(), m_peer_list
				? m_peer_list->num_connect_candidates() : -1);
		}
#endif
		if (need_update) state_updated();

		update_want_peers();

		// post unconditionally if the announce was triggered manually
		if (m_ses.alerts().should_post<tracker_reply_alert>()
			|| r.triggered_manually)
		{
			int peer_count = int(resp.peers.size() + resp.peers4.size());
#if TORRENT_USE_I2P
			peer_count += int(resp.i2p_peers.size());
#endif
			m_ses.alerts().emplace_alert<tracker_reply_alert>(
				get_handle(), local_endpoint, peer_count
				+ int(resp.peers6.size()), v, r.url);
		}

		do_connect_boost();

		state_updated();
	}